

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char sqlite3AffinityType(char *zIn,Column *pCol)

{
  int iVar1;
  byte *pbVar2;
  char cVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  byte *zNum;
  uint uVar7;
  int local_1c;
  
  bVar6 = *zIn;
  if (bVar6 == 0) {
    bVar5 = 0x43;
LAB_00171a03:
    if (pCol == (Column *)0x0) {
      return bVar5;
    }
    iVar1 = 0;
    goto LAB_00171a0a;
  }
  pbVar2 = (byte *)(zIn + 1);
  zNum = (byte *)0x0;
  bVar5 = 0x43;
  uVar4 = 0;
LAB_00171910:
  uVar7 = uVar4 << 8;
  uVar4 = ""[bVar6] | uVar7;
  if ((int)uVar4 < 0x636c6f62) {
    if (uVar4 == 0x626c6f62) {
      if ((bVar5 != 0x45) && (bVar5 != 0x43)) goto LAB_00171976;
      bVar6 = *pbVar2;
      if (bVar6 == 0x28) {
        zNum = pbVar2;
      }
      bVar5 = 0x41;
      goto LAB_001719bf;
    }
    if (uVar4 == 0x63686172) {
      bVar5 = 0x42;
      zNum = pbVar2;
      goto LAB_001719bc;
    }
LAB_00171976:
    if (uVar4 != 0x646f7562 && (uVar4 != 0x666c6f61 && uVar4 != 0x7265616c) || bVar5 != 0x43) {
      if (((uint)""[bVar6] | uVar7 & 0xffffff) != 0x696e74) goto LAB_001719bc;
      bVar5 = 0x44;
      goto LAB_00171a03;
    }
    bVar5 = 0x45;
  }
  else {
    if ((uVar4 != 0x636c6f62) && (uVar4 != 0x74657874)) goto LAB_00171976;
    bVar5 = 0x42;
  }
LAB_001719bc:
  bVar6 = *pbVar2;
LAB_001719bf:
  pbVar2 = pbVar2 + 1;
  if (bVar6 == 0) goto code_r0x001719cb;
  goto LAB_00171910;
code_r0x001719cb:
  if (pCol == (Column *)0x0) {
    return bVar5;
  }
  local_1c = 0;
  iVar1 = 0;
  if (bVar5 < 0x43) {
    if (zNum == (byte *)0x0) {
      iVar1 = 4;
    }
    else {
      bVar6 = *zNum;
      while (iVar1 = 0, bVar6 != 0) {
        if (0xfffffffffffffff5 < (ulong)bVar6 - 0x3a) {
          sqlite3GetInt32((char *)zNum,&local_1c);
          iVar1 = local_1c + 3;
          if (-1 < local_1c) {
            iVar1 = local_1c;
          }
          iVar1 = iVar1 >> 2;
          break;
        }
        pbVar2 = zNum + 1;
        zNum = zNum + 1;
        bVar6 = *pbVar2;
      }
    }
  }
LAB_00171a0a:
  cVar3 = -2;
  if (iVar1 < 0xfe) {
    cVar3 = (char)iVar1;
  }
  pCol->szEst = cVar3 + '\x01';
  return bVar5;
}

Assistant:

SQLITE_PRIVATE char sqlite3AffinityType(const char *zIn, Column *pCol){
  u32 h = 0;
  char aff = SQLITE_AFF_NUMERIC;
  const char *zChar = 0;

  assert( zIn!=0 );
  while( zIn[0] ){
    h = (h<<8) + sqlite3UpperToLower[(*zIn)&0xff];
    zIn++;
    if( h==(('c'<<24)+('h'<<16)+('a'<<8)+'r') ){             /* CHAR */
      aff = SQLITE_AFF_TEXT;
      zChar = zIn;
    }else if( h==(('c'<<24)+('l'<<16)+('o'<<8)+'b') ){       /* CLOB */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('t'<<24)+('e'<<16)+('x'<<8)+'t') ){       /* TEXT */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('b'<<24)+('l'<<16)+('o'<<8)+'b')          /* BLOB */
        && (aff==SQLITE_AFF_NUMERIC || aff==SQLITE_AFF_REAL) ){
      aff = SQLITE_AFF_BLOB;
      if( zIn[0]=='(' ) zChar = zIn;
#ifndef SQLITE_OMIT_FLOATING_POINT
    }else if( h==(('r'<<24)+('e'<<16)+('a'<<8)+'l')          /* REAL */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('f'<<24)+('l'<<16)+('o'<<8)+'a')          /* FLOA */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('d'<<24)+('o'<<16)+('u'<<8)+'b')          /* DOUB */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
#endif
    }else if( (h&0x00FFFFFF)==(('i'<<16)+('n'<<8)+'t') ){    /* INT */
      aff = SQLITE_AFF_INTEGER;
      break;
    }
  }

  /* If pCol is not NULL, store an estimate of the field size.  The
  ** estimate is scaled so that the size of an integer is 1.  */
  if( pCol ){
    int v = 0;   /* default size is approx 4 bytes */
    if( aff<SQLITE_AFF_NUMERIC ){
      if( zChar ){
        while( zChar[0] ){
          if( sqlite3Isdigit(zChar[0]) ){
            /* BLOB(k), VARCHAR(k), CHAR(k) -> r=(k/4+1) */
            sqlite3GetInt32(zChar, &v);
            break;
          }
          zChar++;
        }
      }else{
        v = 16;   /* BLOB, TEXT, CLOB -> r=5  (approx 20 bytes)*/
      }
    }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( v>=sqlite3GlobalConfig.szSorterRef ){
      pCol->colFlags |= COLFLAG_SORTERREF;
    }
#endif
    v = v/4 + 1;
    if( v>255 ) v = 255;
    pCol->szEst = v;
  }
  return aff;
}